

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

int LogLuvSetupEncode(TIFF *tif)

{
  ushort uVar1;
  uint8_t *puVar2;
  int iVar3;
  code *pcVar4;
  char *pcVar5;
  
  puVar2 = tif->tif_data;
  uVar1 = (tif->tif_dir).td_photometric;
  if (uVar1 == 0x804c) {
    iVar3 = LogL16InitState(tif);
    if (iVar3 == 0) {
      return 0;
    }
    tif->tif_encoderow = LogL16Encode;
    if (*(int *)(puVar2 + 4) != 0) {
      if (*(int *)(puVar2 + 4) != 1) {
LAB_002a6852:
        pcVar5 = "XYZ, Luv";
        if ((tif->tif_dir).td_photometric == 0x804c) {
          pcVar5 = "Y, L";
        }
        TIFFErrorExtR(tif,"LogLuvSetupEncode",
                      "SGILog compression supported only for %s, or raw data",pcVar5);
        return 0;
      }
      goto LAB_002a68a3;
    }
    pcVar4 = L16fromY;
  }
  else {
    if (uVar1 != 0x804d) {
      TIFFErrorExtR(tif,"LogLuvSetupEncode",
                    "Inappropriate photometric interpretation %u for SGILog compression; %s",
                    (ulong)uVar1,"must be either LogLUV or LogL");
      return 0;
    }
    iVar3 = LogLuvInitState(tif);
    if (iVar3 == 0) {
      return 0;
    }
    if ((tif->tif_dir).td_compression == 0x8775) {
      tif->tif_encoderow = LogLuvEncode24;
      iVar3 = *(int *)(puVar2 + 4);
      if (iVar3 == 0) {
        pcVar4 = Luv24fromXYZ;
      }
      else {
        if (iVar3 == 2) goto LAB_002a68a3;
        if (iVar3 != 1) goto LAB_002a6852;
        pcVar4 = Luv24fromLuv48;
      }
    }
    else {
      tif->tif_encoderow = LogLuvEncode32;
      iVar3 = *(int *)(puVar2 + 4);
      if (iVar3 == 0) {
        pcVar4 = Luv32fromXYZ;
      }
      else {
        if (iVar3 == 2) goto LAB_002a68a3;
        if (iVar3 != 1) goto LAB_002a6852;
        pcVar4 = Luv32fromLuv48;
      }
    }
  }
  *(code **)(puVar2 + 0x20) = pcVar4;
LAB_002a68a3:
  puVar2[0] = '\x01';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  return 1;
}

Assistant:

static int LogLuvSetupEncode(TIFF *tif)
{
    static const char module[] = "LogLuvSetupEncode";
    LogLuvState *sp = EncoderState(tif);
    TIFFDirectory *td = &tif->tif_dir;

    switch (td->td_photometric)
    {
        case PHOTOMETRIC_LOGLUV:
            if (!LogLuvInitState(tif))
                return (0);
            if (td->td_compression == COMPRESSION_SGILOG24)
            {
                tif->tif_encoderow = LogLuvEncode24;
                switch (sp->user_datafmt)
                {
                    case SGILOGDATAFMT_FLOAT:
                        sp->tfunc = Luv24fromXYZ;
                        break;
                    case SGILOGDATAFMT_16BIT:
                        sp->tfunc = Luv24fromLuv48;
                        break;
                    case SGILOGDATAFMT_RAW:
                        break;
                    default:
                        goto notsupported;
                }
            }
            else
            {
                tif->tif_encoderow = LogLuvEncode32;
                switch (sp->user_datafmt)
                {
                    case SGILOGDATAFMT_FLOAT:
                        sp->tfunc = Luv32fromXYZ;
                        break;
                    case SGILOGDATAFMT_16BIT:
                        sp->tfunc = Luv32fromLuv48;
                        break;
                    case SGILOGDATAFMT_RAW:
                        break;
                    default:
                        goto notsupported;
                }
            }
            break;
        case PHOTOMETRIC_LOGL:
            if (!LogL16InitState(tif))
                return (0);
            tif->tif_encoderow = LogL16Encode;
            switch (sp->user_datafmt)
            {
                case SGILOGDATAFMT_FLOAT:
                    sp->tfunc = L16fromY;
                    break;
                case SGILOGDATAFMT_16BIT:
                    break;
                default:
                    goto notsupported;
            }
            break;
        default:
            TIFFErrorExtR(tif, module,
                          "Inappropriate photometric interpretation %" PRIu16
                          " for SGILog compression; %s",
                          td->td_photometric, "must be either LogLUV or LogL");
            return (0);
    }
    sp->encoder_state = 1;
    return (1);
notsupported:
    TIFFErrorExtR(tif, module,
                  "SGILog compression supported only for %s, or raw data",
                  td->td_photometric == PHOTOMETRIC_LOGL ? "Y, L" : "XYZ, Luv");
    return (0);
}